

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkcookie.cpp
# Opt level: O0

void __thiscall QNetworkCookie::setSameSitePolicy(QNetworkCookie *this,SameSite sameSite)

{
  QNetworkCookiePrivate *pQVar1;
  SameSite in_ESI;
  
  pQVar1 = QSharedDataPointer<QNetworkCookiePrivate>::operator->
                     ((QSharedDataPointer<QNetworkCookiePrivate> *)CONCAT44(in_ESI,in_ESI));
  pQVar1->sameSite = in_ESI;
  return;
}

Assistant:

void QNetworkCookie::setSameSitePolicy(QNetworkCookie::SameSite sameSite)
{
    d->sameSite = sameSite;
}